

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_coin_selection.cpp
# Opt level: O3

CoinSelectionOption * GetBitcoinOption(void)

{
  CoinSelectionOption *extraout_RAX;
  CoinSelectionOption *in_RDI;
  
  cfd::CoinSelectionOption::CoinSelectionOption(in_RDI);
  cfd::CoinSelectionOption::InitializeTxSizeInfo(in_RDI);
  return extraout_RAX;
}

Assistant:

static CoinSelectionOption GetBitcoinOption() {
  CoinSelectionOption option;
  option.InitializeTxSizeInfo();
  return option;
}